

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QJsonValue * __thiscall QVariant::toJsonValue(QJsonValue *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QJsonValue>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QJsonValue QVariant::toJsonValue() const
{
    return qvariant_cast<QJsonValue>(*this);
}